

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

lbool __thiscall Minisat::Solver::prefetchAssumptions(Solver *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CRef CVar4;
  vec<Minisat::Lit> *this_00;
  Lit *pLVar5;
  Solver *in_RDI;
  CRef confl;
  CRef in_stack_00000030;
  Lit p;
  Lit in_stack_00000044;
  bool in_stack_0000005b;
  int in_stack_0000005c;
  Solver *in_stack_00000060;
  Solver *in_stack_00000210;
  uint in_stack_ffffffffffffffc4;
  Lit in_stack_ffffffffffffffd0;
  lbool local_25;
  int local_24;
  lbool local_1e;
  lbool local_1d;
  int local_1c;
  lbool local_15;
  int local_14;
  lbool local_1;
  
  if ((((in_RDI->prefetch_assumptions & 1U) != 0) &&
      (iVar2 = decisionLevel((Solver *)0x1371ca), iVar2 == 0)) &&
     (iVar2 = vec<Minisat::Lit>::size(&in_RDI->assumptions), 0 < iVar2)) {
    while( true ) {
      iVar2 = decisionLevel((Solver *)0x1371f9);
      iVar3 = vec<Minisat::Lit>::size(&in_RDI->assumptions);
      in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xffffff;
      if (iVar2 < iVar3) {
        iVar3 = decisionLevel((Solver *)0x137228);
        in_stack_ffffffffffffffc4 =
             CONCAT13(iVar3 < in_RDI->last_used_assumptions,(int3)in_stack_ffffffffffffffc4);
      }
      if ((char)(in_stack_ffffffffffffffc4 >> 0x18) == '\0') goto LAB_00137331;
      this_00 = &in_RDI->assumptions;
      iVar3 = decisionLevel((Solver *)0x13725e);
      pLVar5 = vec<Minisat::Lit>::operator[](this_00,iVar3);
      local_1c = pLVar5->x;
      local_14 = local_1c;
      local_15 = value(in_RDI,in_stack_ffffffffffffffd0);
      lbool::lbool(&local_1d,'\x01');
      bVar1 = lbool::operator==(&local_15,local_1d);
      if (bVar1) break;
      newDecisionLevel((Solver *)CONCAT44(in_stack_ffffffffffffffc4,iVar2));
      local_24 = local_14;
      local_1e = value(in_RDI,in_stack_ffffffffffffffd0);
      lbool::lbool(&local_25,'\x02');
      bVar1 = lbool::operator==(&local_1e,local_25);
      if (bVar1) {
        decisionLevel((Solver *)0x137317);
        uncheckedEnqueue(this,in_stack_00000044,p.x,in_stack_00000030);
      }
    }
    cancelUntil(in_stack_00000060,in_stack_0000005c,in_stack_0000005b);
LAB_00137331:
    CVar4 = propagate(in_stack_00000210);
    if (CVar4 != 0xffffffff) {
      cancelUntil(in_stack_00000060,in_stack_0000005c,in_stack_0000005b);
    }
  }
  lbool::lbool(&local_1,'\x02');
  return (lbool)local_1.value;
}

Assistant:

lbool Solver::prefetchAssumptions()
{
    if (prefetch_assumptions && decisionLevel() == 0 && assumptions.size() > 0) {
        while (decisionLevel() < assumptions.size() && decisionLevel() < last_used_assumptions) {
            // Perform user provided assumption:
            Lit p = assumptions[decisionLevel()];

            if (value(p) == l_False) {
                // TODO: write proper conflict handling
                cancelUntil(0);
                break;
            }

            newDecisionLevel();
            if (value(p) == l_Undef) uncheckedEnqueue(p, decisionLevel(), CRef_Undef);
        }

        assert((decisionLevel() == 0 || decisionLevel() == assumptions.size()) &&
               "we propagated all assumptions by now");

        // TODO: write proper conflict handling
        CRef confl = propagate();
        if (confl != CRef_Undef) {
            cancelUntil(0);
        }
    }

    return l_Undef; // for now, we just work with the generic case
}